

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

CCommandInfo * __thiscall
CConsole::GetCommandInfo(CConsole *this,char *pName,int FlagMask,bool Temp)

{
  int iVar1;
  undefined1 in_CL;
  uint in_EDX;
  long in_RDI;
  CCommand *pCommand;
  CCommandInfo *b;
  undefined3 in_stack_ffffffffffffffe0;
  uint uVar2;
  
  uVar2 = CONCAT13(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffff;
  b = *(CCommandInfo **)(in_RDI + 0x28);
  while( true ) {
    if (b == (CCommandInfo *)0x0) {
      return (CCommandInfo *)0x0;
    }
    if ((((b[1].m_AccessLevel & in_EDX) != 0) &&
        ((b[1].field_0xc & 1) == ((byte)(uVar2 >> 0x18) & 1))) &&
       (iVar1 = str_comp_nocase((char *)CONCAT44(in_EDX,uVar2),(char *)b), iVar1 == 0)) break;
    b = (CCommandInfo *)b[1]._vptr_CCommandInfo;
  }
  return b;
}

Assistant:

const IConsole::CCommandInfo *CConsole::GetCommandInfo(const char *pName, int FlagMask, bool Temp)
{
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp)
		{
			if(str_comp_nocase(pCommand->m_pName, pName) == 0)
				return pCommand;
		}
	}

	return 0;
}